

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QThread::setPriority(QThread *this,Priority priority)

{
  QThreadPrivate *pQVar1;
  int in_ESI;
  QThreadPrivate *in_RDI;
  long in_FS_OFFSET;
  QThreadPrivate *d;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  Priority in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QMessageLogger local_58;
  QMessageLogger local_38;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 7) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (char *)in_RDI,in_stack_ffffffffffffff74,(char *)in_stack_ffffffffffffff68);
    QMessageLogger::warning(&local_38,"QThread::setPriority: Argument cannot be InheritPriority");
  }
  else {
    pQVar1 = d_func((QThread *)0x5576eb);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
               ,in_stack_ffffffffffffff68);
    if (pQVar1->threadState == Running) {
      QThreadPrivate::setPriority(in_RDI,in_stack_ffffffffffffff74);
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (char *)in_RDI,in_stack_ffffffffffffff74,(char *)in_stack_ffffffffffffff68);
      QMessageLogger::warning
                (&local_58,"QThread::setPriority: Cannot set priority, thread is not running");
    }
    QMutexLocker<QMutex>::~QMutexLocker
              ((QMutexLocker<QMutex> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThread::setPriority(Priority priority)
{
    if (priority == QThread::InheritPriority) {
        qWarning("QThread::setPriority: Argument cannot be InheritPriority");
        return;
    }
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);
    if (d->threadState != QThreadPrivate::Running) {
        qWarning("QThread::setPriority: Cannot set priority, thread is not running");
        return;
    }
    d->setPriority(priority);
}